

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::Extension::IsInitialized
          (Extension *this,ExtensionSet *ext_set,MessageLite *extendee,int number,Arena *arena)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  CppType CVar4;
  int iVar5;
  const_reference this_00;
  MessageLite **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar6;
  string_view v;
  LogMessage local_70;
  Voidify local_59;
  void *local_58;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MessageLite *prototype;
  Arena *pAStack_38;
  int i;
  Arena *arena_local;
  MessageLite *pMStack_28;
  int number_local;
  MessageLite *extendee_local;
  ExtensionSet *ext_set_local;
  Extension *this_local;
  
  pAStack_38 = arena;
  arena_local._4_4_ = number;
  pMStack_28 = extendee;
  extendee_local = (MessageLite *)ext_set;
  ext_set_local = (ExtensionSet *)this;
  CVar4 = anon_unknown_59::cpp_type(this->type);
  if (CVar4 == CPPTYPE_MESSAGE) {
    if ((this->is_repeated & 1U) == 0) {
      if (((byte)this->field_0xa >> 1 & 1) == 0) {
        if (((byte)this->field_0xa >> 2 & 1) == 0) {
          this_local._7_1_ = MessageLite::IsInitialized(this->field_0);
        }
        else {
          absl_log_internal_check_op_result =
               (Nullable<const_char_*>)
               GetPrototypeForLazyMessage
                         ((ExtensionSet *)extendee_local,pMStack_28,arena_local._4_4_);
          v1 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::MessageLite_const*>
                         ((MessageLite **)&absl_log_internal_check_op_result);
          local_58 = (void *)0x0;
          v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_58)
          ;
          local_50 = absl::lts_20250127::log_internal::
                     Check_NEImpl<google::protobuf::MessageLite_const*,decltype(nullptr)>
                               (v1,v2,"prototype != nullptr");
          if (local_50 != (Nullable<const_char_*>)0x0) {
            failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_50);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,0x69d,failure_msg);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar6,(char (*) [11])"extendee: ");
            v = MessageLite::GetTypeName(pMStack_28);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,v);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar6,(char (*) [11])"; number: ");
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar6,arena_local._4_4_);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar6);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_70);
          }
          bVar3 = (**(code **)(**(long **)&(this->field_0).int32_t_value + 0x50))
                            (*(long **)&(this->field_0).int32_t_value,
                             absl_log_internal_check_op_result,pAStack_38);
          this_local._7_1_ = (bool)(bVar3 & 1);
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      for (prototype._4_4_ = 0; iVar1 = prototype._4_4_,
          iVar5 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0),
          iVar1 < iVar5; prototype._4_4_ = prototype._4_4_ + 1) {
        this_00 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)this->field_0,
                             prototype._4_4_);
        bVar2 = MessageLite::IsInitialized(this_00);
        if (!bVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized(const ExtensionSet* ext_set,
                                            const MessageLite* extendee,
                                            int number, Arena* arena) const {
  if (cpp_type(type) != WireFormatLite::CPPTYPE_MESSAGE) return true;

  if (is_repeated) {
    for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
      if (!ptr.repeated_message_value->Get(i).IsInitialized()) {
        return false;
      }
    }
    return true;
  }

  if (is_cleared) return true;

  if (!is_lazy) return ptr.message_value->IsInitialized();

  const MessageLite* prototype =
      ext_set->GetPrototypeForLazyMessage(extendee, number);
  ABSL_DCHECK_NE(prototype, nullptr)
      << "extendee: " << extendee->GetTypeName() << "; number: " << number;
  return ptr.lazymessage_value->IsInitialized(prototype, arena);
}